

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmuxgenerator.cpp
# Opt level: O3

string * __thiscall
PortMuxGenerator::extractPortFromString_abi_cxx11_
          (string *__return_storage_ptr__,PortMuxGenerator *this,int muxIndex,int portIndex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer piVar3;
  size_type sVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  string local_b8;
  int local_94;
  string *local_90;
  int local_84;
  PortMuxGenerator *local_80;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar3 = (this->numPorts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->numPorts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  uVar7 = (ulong)muxIndex;
  local_94 = muxIndex;
  local_90 = __return_storage_ptr__;
  local_84 = portIndex;
  local_80 = this;
  if (portIndex == 1) {
    if (uVar5 <= uVar7) {
LAB_0010f9d6:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if (piVar3[uVar7] != 1) {
      paVar1 = &local_b8.field_2;
      uVar5 = 0;
      do {
        getMuxPorts_abi_cxx11_(&local_b8,this,muxIndex);
        sVar4 = local_b8._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        this = local_80;
        muxIndex = local_94;
        if (sVar4 <= uVar5) goto LAB_0010f8dc;
        getMuxPorts_abi_cxx11_(&local_b8,local_80,local_94);
        if (local_b8._M_string_length <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
        }
        cVar2 = local_b8._M_dataplus._M_p[uVar5];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        uVar5 = uVar5 + 1;
      } while (cVar2 != ',');
      getMuxPorts_abi_cxx11_(&local_78,this,muxIndex);
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_78);
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
      local_50.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) goto LAB_0010f8b9;
      goto LAB_0010f8c1;
    }
    getMuxPorts_abi_cxx11_(&local_b8,this,muxIndex);
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
    local_78.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_0010f8dc;
  }
  else {
    if (uVar5 <= uVar7) goto LAB_0010f9d6;
    if (piVar3[uVar7] == portIndex) {
      iVar6 = 1;
      uVar5 = 0;
      while( true ) {
        getMuxPorts_abi_cxx11_(&local_b8,this,muxIndex);
        sVar4 = local_b8._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        this = local_80;
        muxIndex = local_94;
        if (sVar4 <= uVar5) goto LAB_0010f8dc;
        getMuxPorts_abi_cxx11_(&local_b8,local_80,local_94);
        if (local_b8._M_string_length <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
        }
        cVar2 = local_b8._M_dataplus._M_p[uVar5];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((cVar2 == ',') && (iVar6 = iVar6 + 1, iVar6 == local_84)) break;
        uVar5 = uVar5 + 1;
      }
      getMuxPorts_abi_cxx11_(&local_78,this,muxIndex);
      getMuxPorts_abi_cxx11_(&local_50,this,muxIndex);
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_78);
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0010f8b9;
    }
    else {
      iVar6 = 1;
      uVar5 = 0;
      while( true ) {
        do {
          uVar7 = uVar5 + 1;
          getMuxPorts_abi_cxx11_(&local_b8,local_80,local_94);
          sVar4 = local_b8._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (sVar4 <= uVar5) goto LAB_0010f8dc;
          getMuxPorts_abi_cxx11_(&local_b8,local_80,local_94);
          if (local_b8._M_string_length <= uVar5) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
          }
          cVar2 = local_b8._M_dataplus._M_p[uVar5];
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          uVar5 = uVar7;
        } while (cVar2 != ',');
        if (iVar6 == local_84) break;
        iVar6 = iVar6 + 1;
      }
      getMuxPorts_abi_cxx11_(&local_78,local_80,local_94);
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_78);
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
      local_50.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0010f8b9:
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
LAB_0010f8c1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0010f8dc;
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_0010f8dc:
  local_b8._M_dataplus._M_p = " ";
  local_b8._M_string_length = 0x11bed4;
  sVar4 = local_90->_M_string_length;
  if (sVar4 != 0) {
    pcVar8 = (local_90->_M_dataplus)._M_p;
    do {
      if (*pcVar8 == ' ') {
        boost::algorithm::detail::
        find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                  (local_90,pcVar8,pcVar8 + 1);
        return local_90;
      }
      pcVar8 = pcVar8 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  return local_90;
}

Assistant:

std::string PortMuxGenerator::extractPortFromString(int muxIndex, int portIndex) {
  std::string port;

  int commasCounter = 1;
  int stringBeginIndex = 0;
  if(portIndex == 1 && getMuxNumPorts(muxIndex) == 1) {
    port = getMuxPorts(muxIndex);
  } else if(portIndex == 1) {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        port = getMuxPorts(muxIndex).substr(0, i);
        break;
      }
    }
  } else if(portIndex == getMuxNumPorts(muxIndex)) {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        commasCounter++;
        stringBeginIndex = i;
        if(commasCounter == portIndex) {
          port = getMuxPorts(muxIndex).substr(i + 1, getMuxPorts(muxIndex).size());
          break;
        }
      }
    }
  } else {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        commasCounter++;
        if(commasCounter == (portIndex + 1)) {
          port = getMuxPorts(muxIndex).substr(stringBeginIndex, (i - stringBeginIndex));
          break;
        } else {
          stringBeginIndex = i + 1;
        }
      }
    }
  }

  boost::erase_all(port, " ");

  return port;
}